

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_ssl_client.cpp
# Opt level: O2

size_t __thiscall
bidfx_public_api::tools::OpenSSLClient::InputStreamImpl::ReadBytes
          (InputStreamImpl *this,uchar *buf,size_t len)

{
  int iVar1;
  
  iVar1 = SSL_read((SSL *)this->open_ssl_client_->ssl_,buf,(int)len);
  if (iVar1 == -1) {
    spdlog::logger::info<>(Log,"Could not read bytes");
  }
  return (long)iVar1;
}

Assistant:

size_t OpenSSLClient::InputStreamImpl::ReadBytes(unsigned char *buf, size_t len)
{
    size_t bytes = SSL_read(open_ssl_client_->ssl_, buf, len);
    if (bytes == -1)
    {
        Log->info("Could not read bytes");
    }
    return bytes;
}